

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# secret_manager.cpp
# Opt level: O1

void __thiscall
duckdb::SecretManager::LoadSecretStorage
          (SecretManager *this,
          unique_ptr<duckdb::SecretStorage,_std::default_delete<duckdb::SecretStorage>,_true>
          *storage)

{
  int iVar1;
  _Head_base<0UL,_duckdb::SecretStorage_*,_false> local_20;
  
  iVar1 = pthread_mutex_lock((pthread_mutex_t *)&this->manager_lock);
  if (iVar1 == 0) {
    local_20._M_head_impl =
         (storage->
         super_unique_ptr<duckdb::SecretStorage,_std::default_delete<duckdb::SecretStorage>_>)._M_t.
         super___uniq_ptr_impl<duckdb::SecretStorage,_std::default_delete<duckdb::SecretStorage>_>.
         _M_t.
         super__Tuple_impl<0UL,_duckdb::SecretStorage_*,_std::default_delete<duckdb::SecretStorage>_>
         .super__Head_base<0UL,_duckdb::SecretStorage_*,_false>._M_head_impl;
    (storage->super_unique_ptr<duckdb::SecretStorage,_std::default_delete<duckdb::SecretStorage>_>).
    _M_t.super___uniq_ptr_impl<duckdb::SecretStorage,_std::default_delete<duckdb::SecretStorage>_>.
    _M_t.
    super__Tuple_impl<0UL,_duckdb::SecretStorage_*,_std::default_delete<duckdb::SecretStorage>_>.
    super__Head_base<0UL,_duckdb::SecretStorage_*,_false>._M_head_impl = (SecretStorage *)0x0;
    LoadSecretStorageInternal
              (this,(unique_ptr<duckdb::SecretStorage,_std::default_delete<duckdb::SecretStorage>,_true>
                     *)&local_20);
    if (local_20._M_head_impl != (SecretStorage *)0x0) {
      (*(local_20._M_head_impl)->_vptr_SecretStorage[1])();
    }
    local_20._M_head_impl = (SecretStorage *)0x0;
    pthread_mutex_unlock((pthread_mutex_t *)&this->manager_lock);
    return;
  }
  ::std::__throw_system_error(iVar1);
}

Assistant:

void SecretManager::LoadSecretStorage(unique_ptr<SecretStorage> storage) {
	lock_guard<mutex> lck(manager_lock);
	return LoadSecretStorageInternal(std::move(storage));
}